

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void cmGlobalGhsMultiGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  size_type __dnew;
  long local_48;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_48 = 0x11;
  local_40 = local_30;
  local_40 = (long *)std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
  local_30[0] = local_48;
  *local_40 = 0x6948206e65657247;
  local_40[1] = 0x544c554d20736c6c;
  *(char *)(local_40 + 2) = 'I';
  local_38 = local_48;
  *(char *)((long)local_40 + local_48) = '\0';
  std::__cxx11::string::operator=((string *)entry,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&entry->Brief,0,(char *)(entry->Brief)._M_string_length,0x5c1823);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetDocumentation(cmDocumentationEntry& entry)
{
  entry.Name = GetActualName();
  entry.Brief =
    "Generates Green Hills MULTI files (experimental, work-in-progress).";
}